

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O2

LONGLONG readlonglong(uchar *infile)

{
  ulong uVar1;
  long lVar2;
  uchar b [8];
  
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    b[lVar2] = infile[lVar2 + nextchar];
  }
  nextchar = nextchar + 8;
  uVar1 = (ulong)b[0];
  for (lVar2 = 1; lVar2 != 8; lVar2 = lVar2 + 1) {
    uVar1 = uVar1 << 8 | (ulong)b[lVar2];
  }
  return uVar1;
}

Assistant:

static LONGLONG readlonglong(unsigned char *infile)
{
int i;
LONGLONG a;
unsigned char b[8];

	/* Read integer A one byte at a time from infile.
	 *
	 * This is portable from Vax to Sun since it eliminates the
	 * need for byte-swapping.
	 *
         *  This routine is only called to read the first 3 values
	 *  in the compressed file, so it doesn't have to be 
	 *  super-efficient
	 */
	for (i=0; i<8; i++) qread(infile,(char *) &b[i],1);
	a = b[0];
	for (i=1; i<8; i++) a = (a<<8) + b[i];
	return(a);
}